

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int iVar1;
  size_t sVar2;
  U32 *in_RCX;
  seqStore_t *in_RDX;
  ZSTD_matchState_t *in_RSI;
  long in_RDI;
  void *in_R8;
  U32 curr;
  ZSTD_dictMode_e in_stack_0000005c;
  size_t in_stack_00000060;
  void *in_stack_00000068;
  U32 *in_stack_00000070;
  seqStore_t *in_stack_00000078;
  ZSTD_matchState_t *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = (int)in_RCX - (int)*(undefined8 *)(in_RDI + 8);
  if (in_R8 < (void *)0x20001) {
    if ((((*(int *)(in_RDI + 0xc4) == 0) && ((in_RSI->window).base == (in_RSI->window).nextSrc)) &&
        (*(int *)(in_RDI + 0x18) == *(int *)(in_RDI + 0x1c))) &&
       ((iVar1 == *(int *)(in_RDI + 0x18) && ((void *)0x8 < in_R8)))) {
      ZSTD_initStats_ultra(in_RSI,in_RDX,in_RCX,in_R8,CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    }
    sVar2 = ZSTD_compressBlock_opt2
                      (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                       in_stack_00000060,in_stack_0000005c);
    return sVar2;
  }
  __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x84b9,
                "size_t ZSTD_compressBlock_btultra2(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const curr = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-passes strategy:
     * this strategy makes a first pass over first block to collect statistics
     * in order to seed next round's statistics with it.
     * After 1st pass, function forgets history, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
    ** the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (curr == ms->window.dictLimit)    /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD) /* input large enough to not employ default stats */
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt2(ms, seqStore, rep, src, srcSize, ZSTD_noDict);
}